

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.h
# Opt level: O0

void fadst8x8_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  int iVar97;
  undefined4 uVar98;
  int iVar99;
  uint uVar100;
  uint uVar101;
  int iVar102;
  uint uVar103;
  int iVar104;
  uint uVar105;
  int iVar106;
  uint uVar107;
  int iVar108;
  int32_t *piVar109;
  char in_DL;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i x4 [8];
  __m128i x3 [8];
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i x2 [8];
  __m128i x1 [8];
  __m128i cospi_p12_m52;
  __m128i cospi_p52_p12;
  __m128i cospi_p28_m36;
  __m128i cospi_p36_p28;
  __m128i cospi_p44_m20;
  __m128i cospi_p20_p44;
  __m128i cospi_p60_m04;
  __m128i cospi_p04_p60;
  __m128i cospi_m48_p16;
  __m128i cospi_p48_m16;
  __m128i cospi_p16_p48;
  __m128i cospi_p32_m32;
  __m128i cospi_p32_p32;
  __m128i __rounding;
  __m128i __zero;
  int32_t *cospi;
  undefined2 local_11d8;
  undefined2 uStack_11d6;
  undefined2 uStack_11d4;
  undefined2 uStack_11d2;
  undefined2 local_11c8;
  undefined2 uStack_11c6;
  undefined2 uStack_11c4;
  undefined2 uStack_11c2;
  undefined2 local_11b8;
  undefined2 uStack_11b6;
  undefined2 uStack_11b4;
  undefined2 uStack_11b2;
  undefined2 local_11a8;
  undefined2 uStack_11a6;
  undefined2 uStack_11a4;
  undefined2 uStack_11a2;
  undefined2 local_1198;
  undefined2 uStack_1196;
  undefined2 uStack_1194;
  undefined2 uStack_1192;
  undefined2 local_1188;
  undefined2 uStack_1186;
  undefined2 uStack_1184;
  undefined2 uStack_1182;
  undefined2 local_1178;
  undefined2 uStack_1176;
  undefined2 uStack_1174;
  undefined2 uStack_1172;
  undefined2 local_1168;
  undefined2 uStack_1166;
  undefined2 uStack_1164;
  undefined2 uStack_1162;
  undefined2 local_1158;
  undefined2 uStack_1156;
  undefined2 uStack_1154;
  undefined2 uStack_1152;
  undefined2 local_1148;
  undefined2 uStack_1146;
  undefined2 uStack_1144;
  undefined2 uStack_1142;
  undefined2 local_1138;
  undefined2 uStack_1136;
  undefined2 uStack_1134;
  undefined2 uStack_1132;
  undefined2 local_1128;
  undefined2 uStack_1126;
  undefined2 uStack_1124;
  undefined2 uStack_1122;
  undefined2 local_1118;
  undefined2 uStack_1116;
  undefined2 uStack_1114;
  undefined2 uStack_1112;
  undefined2 local_1108;
  undefined2 uStack_1106;
  undefined2 uStack_1104;
  undefined2 uStack_1102;
  undefined2 local_10f8;
  undefined2 uStack_10f6;
  undefined2 uStack_10f4;
  undefined2 uStack_10f2;
  undefined2 local_10e8;
  undefined2 uStack_10e6;
  undefined2 uStack_10e4;
  undefined2 uStack_10e2;
  undefined2 uStack_10d0;
  undefined2 uStack_10ce;
  undefined2 uStack_10cc;
  undefined2 uStack_10ca;
  undefined2 uStack_10c0;
  undefined2 uStack_10be;
  undefined2 uStack_10bc;
  undefined2 uStack_10ba;
  undefined2 uStack_10b0;
  undefined2 uStack_10ae;
  undefined2 uStack_10ac;
  undefined2 uStack_10aa;
  undefined2 uStack_10a0;
  undefined2 uStack_109e;
  undefined2 uStack_109c;
  undefined2 uStack_109a;
  undefined2 uStack_1090;
  undefined2 uStack_108e;
  undefined2 uStack_108c;
  undefined2 uStack_108a;
  undefined2 uStack_1080;
  undefined2 uStack_107e;
  undefined2 uStack_107c;
  undefined2 uStack_107a;
  undefined2 uStack_1070;
  undefined2 uStack_106e;
  undefined2 uStack_106c;
  undefined2 uStack_106a;
  undefined2 uStack_1060;
  undefined2 uStack_105e;
  undefined2 uStack_105c;
  undefined2 uStack_105a;
  undefined2 uStack_1050;
  undefined2 uStack_104e;
  undefined2 uStack_104c;
  undefined2 uStack_104a;
  undefined2 uStack_1040;
  undefined2 uStack_103e;
  undefined2 uStack_103c;
  undefined2 uStack_103a;
  undefined2 uStack_1030;
  undefined2 uStack_102e;
  undefined2 uStack_102c;
  undefined2 uStack_102a;
  undefined2 uStack_1020;
  undefined2 uStack_101e;
  undefined2 uStack_101c;
  undefined2 uStack_101a;
  undefined2 uStack_1010;
  undefined2 uStack_100e;
  undefined2 uStack_100c;
  undefined2 uStack_100a;
  undefined2 uStack_1000;
  undefined2 uStack_ffe;
  undefined2 uStack_ffc;
  undefined2 uStack_ffa;
  undefined2 uStack_ff0;
  undefined2 uStack_fee;
  undefined2 uStack_fec;
  undefined2 uStack_fea;
  undefined2 uStack_fe0;
  undefined2 uStack_fde;
  undefined2 uStack_fdc;
  undefined2 uStack_fda;
  int local_bc8;
  int iStack_bc4;
  int iStack_bc0;
  int iStack_bbc;
  int local_ba8;
  int iStack_ba4;
  int iStack_ba0;
  int iStack_b9c;
  int local_b88;
  int iStack_b84;
  int iStack_b80;
  int iStack_b7c;
  int local_b68;
  int iStack_b64;
  int iStack_b60;
  int iStack_b5c;
  int local_b48;
  int iStack_b44;
  int iStack_b40;
  int iStack_b3c;
  int local_b28;
  int iStack_b24;
  int iStack_b20;
  int iStack_b1c;
  int local_b08;
  int iStack_b04;
  int iStack_b00;
  int iStack_afc;
  int local_ae8;
  int iStack_ae4;
  int iStack_ae0;
  int iStack_adc;
  int local_ac8;
  int iStack_ac4;
  int iStack_ac0;
  int iStack_abc;
  int local_aa8;
  int iStack_aa4;
  int iStack_aa0;
  int iStack_a9c;
  int local_a88;
  int iStack_a84;
  int iStack_a80;
  int iStack_a7c;
  int local_a68;
  int iStack_a64;
  int iStack_a60;
  int iStack_a5c;
  int local_a48;
  int iStack_a44;
  int iStack_a40;
  int iStack_a3c;
  int local_a28;
  int iStack_a24;
  int iStack_a20;
  int iStack_a1c;
  int local_a08;
  int iStack_a04;
  int iStack_a00;
  int iStack_9fc;
  int local_9e8;
  int iStack_9e4;
  int iStack_9e0;
  int iStack_9dc;
  int local_9c8;
  int iStack_9c4;
  int iStack_9c0;
  int iStack_9bc;
  int local_9a8;
  int iStack_9a4;
  int iStack_9a0;
  int iStack_99c;
  int local_988;
  int iStack_984;
  int iStack_980;
  int iStack_97c;
  int local_968;
  int iStack_964;
  int iStack_960;
  int iStack_95c;
  int local_948;
  int iStack_944;
  int iStack_940;
  int iStack_93c;
  int local_928;
  int iStack_924;
  int iStack_920;
  int iStack_91c;
  int local_908;
  int iStack_904;
  int iStack_900;
  int iStack_8fc;
  int local_8e8;
  int iStack_8e4;
  int iStack_8e0;
  int iStack_8dc;
  int local_8c8;
  int iStack_8c4;
  int iStack_8c0;
  int iStack_8bc;
  int local_8a8;
  int iStack_8a4;
  int iStack_8a0;
  int iStack_89c;
  int local_888;
  int iStack_884;
  int iStack_880;
  int iStack_87c;
  int local_868;
  int iStack_864;
  int iStack_860;
  int iStack_85c;
  int local_848;
  int iStack_844;
  int iStack_840;
  int iStack_83c;
  int local_828;
  int iStack_824;
  int iStack_820;
  int iStack_81c;
  int local_808;
  int iStack_804;
  int iStack_800;
  int iStack_7fc;
  int local_7e8;
  int iStack_7e4;
  int iStack_7e0;
  int iStack_7dc;
  
  piVar109 = cospi_arr((int)in_DL);
  iVar97 = 1 << (in_DL - 1U & 0x1f);
  uVar98 = CONCAT22((short)piVar109[0x20],(short)piVar109[0x20]);
  uVar91 = CONCAT44(uVar98,uVar98);
  uVar92 = CONCAT44(uVar98,uVar98);
  iVar99 = (piVar109[0x20] & 0xffffU) + piVar109[0x20] * -0x10000;
  uVar93 = CONCAT44(iVar99,iVar99);
  uVar94 = CONCAT44(iVar99,iVar99);
  uVar100 = (uint)*(ushort *)(piVar109 + 0x10) | piVar109[0x30] << 0x10;
  uVar95 = CONCAT44(uVar100,uVar100);
  uVar96 = CONCAT44(uVar100,uVar100);
  iVar99 = (uint)*(ushort *)(piVar109 + 0x30) + piVar109[0x10] * -0x10000;
  uVar100 = -piVar109[0x30] & 0xffffU | piVar109[0x10] << 0x10;
  uVar101 = (uint)*(ushort *)(piVar109 + 4) | piVar109[0x3c] << 0x10;
  iVar102 = (uint)*(ushort *)(piVar109 + 0x3c) + piVar109[4] * -0x10000;
  uVar103 = (uint)*(ushort *)(piVar109 + 0x14) | piVar109[0x2c] << 0x10;
  iVar104 = (uint)*(ushort *)(piVar109 + 0x2c) + piVar109[0x14] * -0x10000;
  uVar105 = (uint)*(ushort *)(piVar109 + 0x24) | piVar109[0x1c] << 0x10;
  iVar106 = (uint)*(ushort *)(piVar109 + 0x1c) + piVar109[0x24] * -0x10000;
  uVar107 = (uint)*(ushort *)(piVar109 + 0x34) | piVar109[0xc] << 0x10;
  iVar108 = (uint)*(ushort *)(piVar109 + 0xc) + piVar109[0x34] * -0x10000;
  auVar110 = psubsw(ZEXT816(0),in_RDI[7]);
  auVar111 = psubsw(ZEXT816(0),in_RDI[3]);
  uVar1 = *(undefined8 *)in_RDI[4];
  uVar2 = *(undefined8 *)(in_RDI[4] + 8);
  auVar112 = psubsw(ZEXT816(0),in_RDI[1]);
  uVar3 = *(undefined8 *)in_RDI[2];
  uVar4 = *(undefined8 *)(in_RDI[2] + 8);
  auVar113 = psubsw(ZEXT816(0),in_RDI[5]);
  local_10e8 = auVar111._0_2_;
  uStack_10e6 = auVar111._2_2_;
  uStack_10e4 = auVar111._4_2_;
  uStack_10e2 = auVar111._6_2_;
  local_10f8 = (undefined2)uVar1;
  uStack_10f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10f2 = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_fe0 = auVar111._8_2_;
  uStack_fde = auVar111._10_2_;
  uStack_fdc = auVar111._12_2_;
  uStack_fda = auVar111._14_2_;
  uStack_ff0 = (undefined2)uVar2;
  uStack_fee = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_fec = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_fea = (undefined2)((ulong)uVar2 >> 0x30);
  auVar58._2_2_ = local_10f8;
  auVar58._0_2_ = local_10e8;
  auVar58._4_2_ = uStack_10e6;
  auVar58._6_2_ = uStack_10f6;
  auVar58._10_2_ = uStack_10f4;
  auVar58._8_2_ = uStack_10e4;
  auVar58._12_2_ = uStack_10e2;
  auVar58._14_2_ = uStack_10f2;
  auVar57._8_8_ = uVar92;
  auVar57._0_8_ = uVar91;
  auVar111 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = uStack_ff0;
  auVar56._0_2_ = uStack_fe0;
  auVar56._4_2_ = uStack_fde;
  auVar56._6_2_ = uStack_fee;
  auVar56._10_2_ = uStack_fec;
  auVar56._8_2_ = uStack_fdc;
  auVar56._12_2_ = uStack_fda;
  auVar56._14_2_ = uStack_fea;
  auVar55._8_8_ = uVar92;
  auVar55._0_8_ = uVar91;
  auVar114 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = local_10f8;
  auVar54._0_2_ = local_10e8;
  auVar54._4_2_ = uStack_10e6;
  auVar54._6_2_ = uStack_10f6;
  auVar54._10_2_ = uStack_10f4;
  auVar54._8_2_ = uStack_10e4;
  auVar54._12_2_ = uStack_10e2;
  auVar54._14_2_ = uStack_10f2;
  auVar53._8_8_ = uVar94;
  auVar53._0_8_ = uVar93;
  auVar115 = pmaddwd(auVar54,auVar53);
  auVar52._2_2_ = uStack_ff0;
  auVar52._0_2_ = uStack_fe0;
  auVar52._4_2_ = uStack_fde;
  auVar52._6_2_ = uStack_fee;
  auVar52._10_2_ = uStack_fec;
  auVar52._8_2_ = uStack_fdc;
  auVar52._12_2_ = uStack_fda;
  auVar52._14_2_ = uStack_fea;
  auVar51._8_8_ = uVar94;
  auVar51._0_8_ = uVar93;
  auVar116 = pmaddwd(auVar52,auVar51);
  local_7e8 = auVar111._0_4_;
  iStack_7e4 = auVar111._4_4_;
  iStack_7e0 = auVar111._8_4_;
  iStack_7dc = auVar111._12_4_;
  local_808 = auVar114._0_4_;
  iStack_804 = auVar114._4_4_;
  iStack_800 = auVar114._8_4_;
  iStack_7fc = auVar114._12_4_;
  local_828 = auVar115._0_4_;
  iStack_824 = auVar115._4_4_;
  iStack_820 = auVar115._8_4_;
  iStack_81c = auVar115._12_4_;
  local_848 = auVar116._0_4_;
  iStack_844 = auVar116._4_4_;
  iStack_840 = auVar116._8_4_;
  iStack_83c = auVar116._12_4_;
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar114 = ZEXT416((uint)(int)in_DL);
  auVar115 = ZEXT416((uint)(int)in_DL);
  auVar116 = ZEXT416((uint)(int)in_DL);
  auVar90._4_4_ = iStack_7e4 + iVar97 >> auVar111;
  auVar90._0_4_ = local_7e8 + iVar97 >> auVar111;
  auVar90._12_4_ = iStack_7dc + iVar97 >> auVar111;
  auVar90._8_4_ = iStack_7e0 + iVar97 >> auVar111;
  auVar89._4_4_ = iStack_804 + iVar97 >> auVar114;
  auVar89._0_4_ = local_808 + iVar97 >> auVar114;
  auVar89._12_4_ = iStack_7fc + iVar97 >> auVar114;
  auVar89._8_4_ = iStack_800 + iVar97 >> auVar114;
  auVar111 = packssdw(auVar90,auVar89);
  auVar88._4_4_ = iStack_824 + iVar97 >> auVar115;
  auVar88._0_4_ = local_828 + iVar97 >> auVar115;
  auVar88._12_4_ = iStack_81c + iVar97 >> auVar115;
  auVar88._8_4_ = iStack_820 + iVar97 >> auVar115;
  auVar87._4_4_ = iStack_844 + iVar97 >> auVar116;
  auVar87._0_4_ = local_848 + iVar97 >> auVar116;
  auVar87._12_4_ = iStack_83c + iVar97 >> auVar116;
  auVar87._8_4_ = iStack_840 + iVar97 >> auVar116;
  auVar114 = packssdw(auVar88,auVar87);
  local_1108 = (undefined2)uVar3;
  uStack_1106 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_1104 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_1102 = (undefined2)((ulong)uVar3 >> 0x30);
  local_1118 = auVar113._0_2_;
  uStack_1116 = auVar113._2_2_;
  uStack_1114 = auVar113._4_2_;
  uStack_1112 = auVar113._6_2_;
  uStack_1000 = (undefined2)uVar4;
  uStack_ffe = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_ffc = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_ffa = (undefined2)((ulong)uVar4 >> 0x30);
  uStack_1010 = auVar113._8_2_;
  uStack_100e = auVar113._10_2_;
  uStack_100c = auVar113._12_2_;
  uStack_100a = auVar113._14_2_;
  auVar50._2_2_ = local_1118;
  auVar50._0_2_ = local_1108;
  auVar50._4_2_ = uStack_1106;
  auVar50._6_2_ = uStack_1116;
  auVar50._10_2_ = uStack_1114;
  auVar50._8_2_ = uStack_1104;
  auVar50._12_2_ = uStack_1102;
  auVar50._14_2_ = uStack_1112;
  auVar49._8_8_ = uVar92;
  auVar49._0_8_ = uVar91;
  auVar113 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = uStack_1010;
  auVar48._0_2_ = uStack_1000;
  auVar48._4_2_ = uStack_ffe;
  auVar48._6_2_ = uStack_100e;
  auVar48._10_2_ = uStack_100c;
  auVar48._8_2_ = uStack_ffc;
  auVar48._12_2_ = uStack_ffa;
  auVar48._14_2_ = uStack_100a;
  auVar47._8_8_ = uVar92;
  auVar47._0_8_ = uVar91;
  auVar115 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = local_1118;
  auVar46._0_2_ = local_1108;
  auVar46._4_2_ = uStack_1106;
  auVar46._6_2_ = uStack_1116;
  auVar46._10_2_ = uStack_1114;
  auVar46._8_2_ = uStack_1104;
  auVar46._12_2_ = uStack_1102;
  auVar46._14_2_ = uStack_1112;
  auVar45._8_8_ = uVar94;
  auVar45._0_8_ = uVar93;
  auVar116 = pmaddwd(auVar46,auVar45);
  auVar44._2_2_ = uStack_1010;
  auVar44._0_2_ = uStack_1000;
  auVar44._4_2_ = uStack_ffe;
  auVar44._6_2_ = uStack_100e;
  auVar44._10_2_ = uStack_100c;
  auVar44._8_2_ = uStack_ffc;
  auVar44._12_2_ = uStack_ffa;
  auVar44._14_2_ = uStack_100a;
  auVar43._8_8_ = uVar94;
  auVar43._0_8_ = uVar93;
  auVar117 = pmaddwd(auVar44,auVar43);
  local_868 = auVar113._0_4_;
  iStack_864 = auVar113._4_4_;
  iStack_860 = auVar113._8_4_;
  iStack_85c = auVar113._12_4_;
  local_888 = auVar115._0_4_;
  iStack_884 = auVar115._4_4_;
  iStack_880 = auVar115._8_4_;
  iStack_87c = auVar115._12_4_;
  local_8a8 = auVar116._0_4_;
  iStack_8a4 = auVar116._4_4_;
  iStack_8a0 = auVar116._8_4_;
  iStack_89c = auVar116._12_4_;
  local_8c8 = auVar117._0_4_;
  iStack_8c4 = auVar117._4_4_;
  iStack_8c0 = auVar117._8_4_;
  iStack_8bc = auVar117._12_4_;
  auVar113 = ZEXT416((uint)(int)in_DL);
  auVar115 = ZEXT416((uint)(int)in_DL);
  auVar116 = ZEXT416((uint)(int)in_DL);
  auVar117 = ZEXT416((uint)(int)in_DL);
  auVar86._4_4_ = iStack_864 + iVar97 >> auVar113;
  auVar86._0_4_ = local_868 + iVar97 >> auVar113;
  auVar86._12_4_ = iStack_85c + iVar97 >> auVar113;
  auVar86._8_4_ = iStack_860 + iVar97 >> auVar113;
  auVar85._4_4_ = iStack_884 + iVar97 >> auVar115;
  auVar85._0_4_ = local_888 + iVar97 >> auVar115;
  auVar85._12_4_ = iStack_87c + iVar97 >> auVar115;
  auVar85._8_4_ = iStack_880 + iVar97 >> auVar115;
  auVar113 = packssdw(auVar86,auVar85);
  auVar84._4_4_ = iStack_8a4 + iVar97 >> auVar116;
  auVar84._0_4_ = local_8a8 + iVar97 >> auVar116;
  auVar84._12_4_ = iStack_89c + iVar97 >> auVar116;
  auVar84._8_4_ = iStack_8a0 + iVar97 >> auVar116;
  auVar83._4_4_ = iStack_8c4 + iVar97 >> auVar117;
  auVar83._0_4_ = local_8c8 + iVar97 >> auVar117;
  auVar83._12_4_ = iStack_8bc + iVar97 >> auVar117;
  auVar83._8_4_ = iStack_8c0 + iVar97 >> auVar117;
  auVar115 = packssdw(auVar84,auVar83);
  auVar116 = paddsw(*in_RDI,auVar111);
  auVar111 = psubsw(*in_RDI,auVar111);
  auVar117 = paddsw(auVar110,auVar114);
  auVar110 = psubsw(auVar110,auVar114);
  auVar114 = paddsw(auVar112,auVar113);
  auVar112 = psubsw(auVar112,auVar113);
  auVar113 = paddsw(in_RDI[6],auVar115);
  auVar115 = psubsw(in_RDI[6],auVar115);
  local_1128 = auVar114._0_2_;
  uStack_1126 = auVar114._2_2_;
  uStack_1124 = auVar114._4_2_;
  uStack_1122 = auVar114._6_2_;
  local_1138 = auVar113._0_2_;
  uStack_1136 = auVar113._2_2_;
  uStack_1134 = auVar113._4_2_;
  uStack_1132 = auVar113._6_2_;
  uStack_1020 = auVar114._8_2_;
  uStack_101e = auVar114._10_2_;
  uStack_101c = auVar114._12_2_;
  uStack_101a = auVar114._14_2_;
  uStack_1030 = auVar113._8_2_;
  uStack_102e = auVar113._10_2_;
  uStack_102c = auVar113._12_2_;
  uStack_102a = auVar113._14_2_;
  auVar42._2_2_ = local_1138;
  auVar42._0_2_ = local_1128;
  auVar42._4_2_ = uStack_1126;
  auVar42._6_2_ = uStack_1136;
  auVar42._10_2_ = uStack_1134;
  auVar42._8_2_ = uStack_1124;
  auVar42._12_2_ = uStack_1122;
  auVar42._14_2_ = uStack_1132;
  auVar41._8_8_ = uVar96;
  auVar41._0_8_ = uVar95;
  auVar113 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = uStack_1030;
  auVar40._0_2_ = uStack_1020;
  auVar40._4_2_ = uStack_101e;
  auVar40._6_2_ = uStack_102e;
  auVar40._10_2_ = uStack_102c;
  auVar40._8_2_ = uStack_101c;
  auVar40._12_2_ = uStack_101a;
  auVar40._14_2_ = uStack_102a;
  auVar39._8_8_ = uVar96;
  auVar39._0_8_ = uVar95;
  auVar114 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = local_1138;
  auVar38._0_2_ = local_1128;
  auVar38._4_2_ = uStack_1126;
  auVar38._6_2_ = uStack_1136;
  auVar38._10_2_ = uStack_1134;
  auVar38._8_2_ = uStack_1124;
  auVar38._12_2_ = uStack_1122;
  auVar38._14_2_ = uStack_1132;
  auVar37._8_8_ = CONCAT44(iVar99,iVar99);
  auVar37._0_8_ = CONCAT44(iVar99,iVar99);
  auVar118 = pmaddwd(auVar38,auVar37);
  auVar36._2_2_ = uStack_1030;
  auVar36._0_2_ = uStack_1020;
  auVar36._4_2_ = uStack_101e;
  auVar36._6_2_ = uStack_102e;
  auVar36._10_2_ = uStack_102c;
  auVar36._8_2_ = uStack_101c;
  auVar36._12_2_ = uStack_101a;
  auVar36._14_2_ = uStack_102a;
  auVar35._8_8_ = CONCAT44(iVar99,iVar99);
  auVar35._0_8_ = CONCAT44(iVar99,iVar99);
  auVar119 = pmaddwd(auVar36,auVar35);
  local_8e8 = auVar113._0_4_;
  iStack_8e4 = auVar113._4_4_;
  iStack_8e0 = auVar113._8_4_;
  iStack_8dc = auVar113._12_4_;
  local_908 = auVar114._0_4_;
  iStack_904 = auVar114._4_4_;
  iStack_900 = auVar114._8_4_;
  iStack_8fc = auVar114._12_4_;
  local_928 = auVar118._0_4_;
  iStack_924 = auVar118._4_4_;
  iStack_920 = auVar118._8_4_;
  iStack_91c = auVar118._12_4_;
  local_948 = auVar119._0_4_;
  iStack_944 = auVar119._4_4_;
  iStack_940 = auVar119._8_4_;
  iStack_93c = auVar119._12_4_;
  auVar113 = ZEXT416((uint)(int)in_DL);
  auVar114 = ZEXT416((uint)(int)in_DL);
  auVar118 = ZEXT416((uint)(int)in_DL);
  auVar119 = ZEXT416((uint)(int)in_DL);
  auVar82._4_4_ = iStack_8e4 + iVar97 >> auVar113;
  auVar82._0_4_ = local_8e8 + iVar97 >> auVar113;
  auVar82._12_4_ = iStack_8dc + iVar97 >> auVar113;
  auVar82._8_4_ = iStack_8e0 + iVar97 >> auVar113;
  auVar81._4_4_ = iStack_904 + iVar97 >> auVar114;
  auVar81._0_4_ = local_908 + iVar97 >> auVar114;
  auVar81._12_4_ = iStack_8fc + iVar97 >> auVar114;
  auVar81._8_4_ = iStack_900 + iVar97 >> auVar114;
  auVar113 = packssdw(auVar82,auVar81);
  auVar80._4_4_ = iStack_924 + iVar97 >> auVar118;
  auVar80._0_4_ = local_928 + iVar97 >> auVar118;
  auVar80._12_4_ = iStack_91c + iVar97 >> auVar118;
  auVar80._8_4_ = iStack_920 + iVar97 >> auVar118;
  auVar79._4_4_ = iStack_944 + iVar97 >> auVar119;
  auVar79._0_4_ = local_948 + iVar97 >> auVar119;
  auVar79._12_4_ = iStack_93c + iVar97 >> auVar119;
  auVar79._8_4_ = iStack_940 + iVar97 >> auVar119;
  auVar114 = packssdw(auVar80,auVar79);
  local_1148 = auVar112._0_2_;
  uStack_1146 = auVar112._2_2_;
  uStack_1144 = auVar112._4_2_;
  uStack_1142 = auVar112._6_2_;
  local_1158 = auVar115._0_2_;
  uStack_1156 = auVar115._2_2_;
  uStack_1154 = auVar115._4_2_;
  uStack_1152 = auVar115._6_2_;
  uStack_1040 = auVar112._8_2_;
  uStack_103e = auVar112._10_2_;
  uStack_103c = auVar112._12_2_;
  uStack_103a = auVar112._14_2_;
  uStack_1050 = auVar115._8_2_;
  uStack_104e = auVar115._10_2_;
  uStack_104c = auVar115._12_2_;
  uStack_104a = auVar115._14_2_;
  auVar34._2_2_ = local_1158;
  auVar34._0_2_ = local_1148;
  auVar34._4_2_ = uStack_1146;
  auVar34._6_2_ = uStack_1156;
  auVar34._10_2_ = uStack_1154;
  auVar34._8_2_ = uStack_1144;
  auVar34._12_2_ = uStack_1142;
  auVar34._14_2_ = uStack_1152;
  auVar33._8_8_ = CONCAT44(uVar100,uVar100);
  auVar33._0_8_ = CONCAT44(uVar100,uVar100);
  auVar112 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = uStack_1050;
  auVar32._0_2_ = uStack_1040;
  auVar32._4_2_ = uStack_103e;
  auVar32._6_2_ = uStack_104e;
  auVar32._10_2_ = uStack_104c;
  auVar32._8_2_ = uStack_103c;
  auVar32._12_2_ = uStack_103a;
  auVar32._14_2_ = uStack_104a;
  auVar31._8_8_ = CONCAT44(uVar100,uVar100);
  auVar31._0_8_ = CONCAT44(uVar100,uVar100);
  auVar115 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = local_1158;
  auVar30._0_2_ = local_1148;
  auVar30._4_2_ = uStack_1146;
  auVar30._6_2_ = uStack_1156;
  auVar30._10_2_ = uStack_1154;
  auVar30._8_2_ = uStack_1144;
  auVar30._12_2_ = uStack_1142;
  auVar30._14_2_ = uStack_1152;
  auVar29._8_8_ = uVar96;
  auVar29._0_8_ = uVar95;
  auVar118 = pmaddwd(auVar30,auVar29);
  auVar28._2_2_ = uStack_1050;
  auVar28._0_2_ = uStack_1040;
  auVar28._4_2_ = uStack_103e;
  auVar28._6_2_ = uStack_104e;
  auVar28._10_2_ = uStack_104c;
  auVar28._8_2_ = uStack_103c;
  auVar28._12_2_ = uStack_103a;
  auVar28._14_2_ = uStack_104a;
  auVar27._8_8_ = uVar96;
  auVar27._0_8_ = uVar95;
  auVar119 = pmaddwd(auVar28,auVar27);
  local_968 = auVar112._0_4_;
  iStack_964 = auVar112._4_4_;
  iStack_960 = auVar112._8_4_;
  iStack_95c = auVar112._12_4_;
  local_988 = auVar115._0_4_;
  iStack_984 = auVar115._4_4_;
  iStack_980 = auVar115._8_4_;
  iStack_97c = auVar115._12_4_;
  local_9a8 = auVar118._0_4_;
  iStack_9a4 = auVar118._4_4_;
  iStack_9a0 = auVar118._8_4_;
  iStack_99c = auVar118._12_4_;
  local_9c8 = auVar119._0_4_;
  iStack_9c4 = auVar119._4_4_;
  iStack_9c0 = auVar119._8_4_;
  iStack_9bc = auVar119._12_4_;
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar115 = ZEXT416((uint)(int)in_DL);
  auVar118 = ZEXT416((uint)(int)in_DL);
  auVar119 = ZEXT416((uint)(int)in_DL);
  auVar78._4_4_ = iStack_964 + iVar97 >> auVar112;
  auVar78._0_4_ = local_968 + iVar97 >> auVar112;
  auVar78._12_4_ = iStack_95c + iVar97 >> auVar112;
  auVar78._8_4_ = iStack_960 + iVar97 >> auVar112;
  auVar77._4_4_ = iStack_984 + iVar97 >> auVar115;
  auVar77._0_4_ = local_988 + iVar97 >> auVar115;
  auVar77._12_4_ = iStack_97c + iVar97 >> auVar115;
  auVar77._8_4_ = iStack_980 + iVar97 >> auVar115;
  auVar112 = packssdw(auVar78,auVar77);
  auVar76._4_4_ = iStack_9a4 + iVar97 >> auVar118;
  auVar76._0_4_ = local_9a8 + iVar97 >> auVar118;
  auVar76._12_4_ = iStack_99c + iVar97 >> auVar118;
  auVar76._8_4_ = iStack_9a0 + iVar97 >> auVar118;
  auVar75._4_4_ = iStack_9c4 + iVar97 >> auVar119;
  auVar75._0_4_ = local_9c8 + iVar97 >> auVar119;
  auVar75._12_4_ = iStack_9bc + iVar97 >> auVar119;
  auVar75._8_4_ = iStack_9c0 + iVar97 >> auVar119;
  auVar115 = packssdw(auVar76,auVar75);
  auVar118 = paddsw(auVar116,auVar113);
  in_RSI[7] = auVar118;
  auVar113 = psubsw(auVar116,auVar113);
  in_RSI[3] = auVar113;
  auVar113 = paddsw(auVar117,auVar114);
  *in_RSI = auVar113;
  auVar113 = psubsw(auVar117,auVar114);
  in_RSI[4] = auVar113;
  auVar113 = paddsw(auVar111,auVar112);
  in_RSI[5] = auVar113;
  auVar111 = psubsw(auVar111,auVar112);
  in_RSI[1] = auVar111;
  auVar111 = paddsw(auVar110,auVar115);
  in_RSI[2] = auVar111;
  auVar110 = psubsw(auVar110,auVar115);
  in_RSI[6] = auVar110;
  uVar1 = *(undefined8 *)*in_RSI;
  uVar2 = *(undefined8 *)in_RSI[7];
  local_1168 = (undefined2)uVar2;
  uStack_1166 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1164 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1162 = (undefined2)((ulong)uVar2 >> 0x30);
  local_1178 = (undefined2)uVar1;
  uStack_1176 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1174 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1172 = (undefined2)((ulong)uVar1 >> 0x30);
  uVar1 = *(undefined8 *)(*in_RSI + 8);
  uVar2 = *(undefined8 *)(in_RSI[7] + 8);
  uStack_1060 = (undefined2)uVar2;
  uStack_105e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_105c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_105a = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_1070 = (undefined2)uVar1;
  uStack_106e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_106c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_106a = (undefined2)((ulong)uVar1 >> 0x30);
  auVar26._2_2_ = local_1178;
  auVar26._0_2_ = local_1168;
  auVar26._4_2_ = uStack_1166;
  auVar26._6_2_ = uStack_1176;
  auVar26._10_2_ = uStack_1174;
  auVar26._8_2_ = uStack_1164;
  auVar26._12_2_ = uStack_1162;
  auVar26._14_2_ = uStack_1172;
  auVar25._8_8_ = CONCAT44(uVar101,uVar101);
  auVar25._0_8_ = CONCAT44(uVar101,uVar101);
  auVar110 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = uStack_1070;
  auVar24._0_2_ = uStack_1060;
  auVar24._4_2_ = uStack_105e;
  auVar24._6_2_ = uStack_106e;
  auVar24._10_2_ = uStack_106c;
  auVar24._8_2_ = uStack_105c;
  auVar24._12_2_ = uStack_105a;
  auVar24._14_2_ = uStack_106a;
  auVar23._8_8_ = CONCAT44(uVar101,uVar101);
  auVar23._0_8_ = CONCAT44(uVar101,uVar101);
  auVar111 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = local_1178;
  auVar22._0_2_ = local_1168;
  auVar22._4_2_ = uStack_1166;
  auVar22._6_2_ = uStack_1176;
  auVar22._10_2_ = uStack_1174;
  auVar22._8_2_ = uStack_1164;
  auVar22._12_2_ = uStack_1162;
  auVar22._14_2_ = uStack_1172;
  auVar21._8_8_ = CONCAT44(iVar102,iVar102);
  auVar21._0_8_ = CONCAT44(iVar102,iVar102);
  auVar112 = pmaddwd(auVar22,auVar21);
  auVar20._2_2_ = uStack_1070;
  auVar20._0_2_ = uStack_1060;
  auVar20._4_2_ = uStack_105e;
  auVar20._6_2_ = uStack_106e;
  auVar20._10_2_ = uStack_106c;
  auVar20._8_2_ = uStack_105c;
  auVar20._12_2_ = uStack_105a;
  auVar20._14_2_ = uStack_106a;
  auVar19._8_8_ = CONCAT44(iVar102,iVar102);
  auVar19._0_8_ = CONCAT44(iVar102,iVar102);
  auVar113 = pmaddwd(auVar20,auVar19);
  local_9e8 = auVar110._0_4_;
  iStack_9e4 = auVar110._4_4_;
  iStack_9e0 = auVar110._8_4_;
  iStack_9dc = auVar110._12_4_;
  local_a08 = auVar111._0_4_;
  iStack_a04 = auVar111._4_4_;
  iStack_a00 = auVar111._8_4_;
  iStack_9fc = auVar111._12_4_;
  local_a28 = auVar112._0_4_;
  iStack_a24 = auVar112._4_4_;
  iStack_a20 = auVar112._8_4_;
  iStack_a1c = auVar112._12_4_;
  local_a48 = auVar113._0_4_;
  iStack_a44 = auVar113._4_4_;
  iStack_a40 = auVar113._8_4_;
  iStack_a3c = auVar113._12_4_;
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar113 = ZEXT416((uint)(int)in_DL);
  auVar74._4_4_ = iStack_9e4 + iVar97 >> auVar110;
  auVar74._0_4_ = local_9e8 + iVar97 >> auVar110;
  auVar74._12_4_ = iStack_9dc + iVar97 >> auVar110;
  auVar74._8_4_ = iStack_9e0 + iVar97 >> auVar110;
  auVar73._4_4_ = iStack_a04 + iVar97 >> auVar111;
  auVar73._0_4_ = local_a08 + iVar97 >> auVar111;
  auVar73._12_4_ = iStack_9fc + iVar97 >> auVar111;
  auVar73._8_4_ = iStack_a00 + iVar97 >> auVar111;
  auVar110 = packssdw(auVar74,auVar73);
  in_RSI[7] = auVar110;
  auVar72._4_4_ = iStack_a24 + iVar97 >> auVar112;
  auVar72._0_4_ = local_a28 + iVar97 >> auVar112;
  auVar72._12_4_ = iStack_a1c + iVar97 >> auVar112;
  auVar72._8_4_ = iStack_a20 + iVar97 >> auVar112;
  auVar71._4_4_ = iStack_a44 + iVar97 >> auVar113;
  auVar71._0_4_ = local_a48 + iVar97 >> auVar113;
  auVar71._12_4_ = iStack_a3c + iVar97 >> auVar113;
  auVar71._8_4_ = iStack_a40 + iVar97 >> auVar113;
  auVar110 = packssdw(auVar72,auVar71);
  *in_RSI = auVar110;
  uVar1 = *(undefined8 *)in_RSI[2];
  uVar2 = *(undefined8 *)in_RSI[5];
  local_1188 = (undefined2)uVar2;
  uStack_1186 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1184 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1182 = (undefined2)((ulong)uVar2 >> 0x30);
  local_1198 = (undefined2)uVar1;
  uStack_1196 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1194 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1192 = (undefined2)((ulong)uVar1 >> 0x30);
  uVar1 = *(undefined8 *)(in_RSI[2] + 8);
  uVar2 = *(undefined8 *)(in_RSI[5] + 8);
  uStack_1080 = (undefined2)uVar2;
  uStack_107e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_107c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_107a = (undefined2)((ulong)uVar2 >> 0x30);
  uStack_1090 = (undefined2)uVar1;
  uStack_108e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_108c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_108a = (undefined2)((ulong)uVar1 >> 0x30);
  auVar18._2_2_ = local_1198;
  auVar18._0_2_ = local_1188;
  auVar18._4_2_ = uStack_1186;
  auVar18._6_2_ = uStack_1196;
  auVar18._10_2_ = uStack_1194;
  auVar18._8_2_ = uStack_1184;
  auVar18._12_2_ = uStack_1182;
  auVar18._14_2_ = uStack_1192;
  auVar17._8_8_ = CONCAT44(uVar103,uVar103);
  auVar17._0_8_ = CONCAT44(uVar103,uVar103);
  auVar110 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = uStack_1090;
  auVar16._0_2_ = uStack_1080;
  auVar16._4_2_ = uStack_107e;
  auVar16._6_2_ = uStack_108e;
  auVar16._10_2_ = uStack_108c;
  auVar16._8_2_ = uStack_107c;
  auVar16._12_2_ = uStack_107a;
  auVar16._14_2_ = uStack_108a;
  auVar15._8_8_ = CONCAT44(uVar103,uVar103);
  auVar15._0_8_ = CONCAT44(uVar103,uVar103);
  auVar111 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = local_1198;
  auVar14._0_2_ = local_1188;
  auVar14._4_2_ = uStack_1186;
  auVar14._6_2_ = uStack_1196;
  auVar14._10_2_ = uStack_1194;
  auVar14._8_2_ = uStack_1184;
  auVar14._12_2_ = uStack_1182;
  auVar14._14_2_ = uStack_1192;
  auVar13._8_8_ = CONCAT44(iVar104,iVar104);
  auVar13._0_8_ = CONCAT44(iVar104,iVar104);
  auVar112 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = uStack_1090;
  auVar12._0_2_ = uStack_1080;
  auVar12._4_2_ = uStack_107e;
  auVar12._6_2_ = uStack_108e;
  auVar12._10_2_ = uStack_108c;
  auVar12._8_2_ = uStack_107c;
  auVar12._12_2_ = uStack_107a;
  auVar12._14_2_ = uStack_108a;
  auVar11._8_8_ = CONCAT44(iVar104,iVar104);
  auVar11._0_8_ = CONCAT44(iVar104,iVar104);
  auVar113 = pmaddwd(auVar12,auVar11);
  local_a68 = auVar110._0_4_;
  iStack_a64 = auVar110._4_4_;
  iStack_a60 = auVar110._8_4_;
  iStack_a5c = auVar110._12_4_;
  local_a88 = auVar111._0_4_;
  iStack_a84 = auVar111._4_4_;
  iStack_a80 = auVar111._8_4_;
  iStack_a7c = auVar111._12_4_;
  local_aa8 = auVar112._0_4_;
  iStack_aa4 = auVar112._4_4_;
  iStack_aa0 = auVar112._8_4_;
  iStack_a9c = auVar112._12_4_;
  local_ac8 = auVar113._0_4_;
  iStack_ac4 = auVar113._4_4_;
  iStack_ac0 = auVar113._8_4_;
  iStack_abc = auVar113._12_4_;
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar113 = ZEXT416((uint)(int)in_DL);
  auVar70._4_4_ = iStack_a64 + iVar97 >> auVar110;
  auVar70._0_4_ = local_a68 + iVar97 >> auVar110;
  auVar70._12_4_ = iStack_a5c + iVar97 >> auVar110;
  auVar70._8_4_ = iStack_a60 + iVar97 >> auVar110;
  auVar69._4_4_ = iStack_a84 + iVar97 >> auVar111;
  auVar69._0_4_ = local_a88 + iVar97 >> auVar111;
  auVar69._12_4_ = iStack_a7c + iVar97 >> auVar111;
  auVar69._8_4_ = iStack_a80 + iVar97 >> auVar111;
  auVar110 = packssdw(auVar70,auVar69);
  in_RSI[5] = auVar110;
  auVar68._4_4_ = iStack_aa4 + iVar97 >> auVar112;
  auVar68._0_4_ = local_aa8 + iVar97 >> auVar112;
  auVar68._12_4_ = iStack_a9c + iVar97 >> auVar112;
  auVar68._8_4_ = iStack_aa0 + iVar97 >> auVar112;
  auVar67._4_4_ = iStack_ac4 + iVar97 >> auVar113;
  auVar67._0_4_ = local_ac8 + iVar97 >> auVar113;
  auVar67._12_4_ = iStack_abc + iVar97 >> auVar113;
  auVar67._8_4_ = iStack_ac0 + iVar97 >> auVar113;
  auVar110 = packssdw(auVar68,auVar67);
  in_RSI[2] = auVar110;
  uVar1 = *(undefined8 *)in_RSI[3];
  uVar2 = *(undefined8 *)in_RSI[4];
  local_11a8 = (undefined2)uVar1;
  uStack_11a6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_11a4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_11a2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_11b8 = (undefined2)uVar2;
  uStack_11b6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_11b4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_11b2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RSI[3] + 8);
  uVar2 = *(undefined8 *)(in_RSI[4] + 8);
  uStack_10a0 = (undefined2)uVar1;
  uStack_109e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_109c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_109a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_10b0 = (undefined2)uVar2;
  uStack_10ae = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10ac = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10aa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar10._2_2_ = local_11b8;
  auVar10._0_2_ = local_11a8;
  auVar10._4_2_ = uStack_11a6;
  auVar10._6_2_ = uStack_11b6;
  auVar10._10_2_ = uStack_11b4;
  auVar10._8_2_ = uStack_11a4;
  auVar10._12_2_ = uStack_11a2;
  auVar10._14_2_ = uStack_11b2;
  auVar9._8_8_ = CONCAT44(uVar105,uVar105);
  auVar9._0_8_ = CONCAT44(uVar105,uVar105);
  auVar110 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = uStack_10b0;
  auVar8._0_2_ = uStack_10a0;
  auVar8._4_2_ = uStack_109e;
  auVar8._6_2_ = uStack_10ae;
  auVar8._10_2_ = uStack_10ac;
  auVar8._8_2_ = uStack_109c;
  auVar8._12_2_ = uStack_109a;
  auVar8._14_2_ = uStack_10aa;
  auVar7._8_8_ = CONCAT44(uVar105,uVar105);
  auVar7._0_8_ = CONCAT44(uVar105,uVar105);
  auVar111 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = local_11b8;
  auVar6._0_2_ = local_11a8;
  auVar6._4_2_ = uStack_11a6;
  auVar6._6_2_ = uStack_11b6;
  auVar6._10_2_ = uStack_11b4;
  auVar6._8_2_ = uStack_11a4;
  auVar6._12_2_ = uStack_11a2;
  auVar6._14_2_ = uStack_11b2;
  auVar5._8_8_ = CONCAT44(iVar106,iVar106);
  auVar5._0_8_ = CONCAT44(iVar106,iVar106);
  auVar112 = pmaddwd(auVar6,auVar5);
  auVar119._2_2_ = uStack_10b0;
  auVar119._0_2_ = uStack_10a0;
  auVar119._4_2_ = uStack_109e;
  auVar119._6_2_ = uStack_10ae;
  auVar119._10_2_ = uStack_10ac;
  auVar119._8_2_ = uStack_109c;
  auVar119._12_2_ = uStack_109a;
  auVar119._14_2_ = uStack_10aa;
  auVar118._8_8_ = CONCAT44(iVar106,iVar106);
  auVar118._0_8_ = CONCAT44(iVar106,iVar106);
  auVar113 = pmaddwd(auVar119,auVar118);
  local_ae8 = auVar110._0_4_;
  iStack_ae4 = auVar110._4_4_;
  iStack_ae0 = auVar110._8_4_;
  iStack_adc = auVar110._12_4_;
  local_b08 = auVar111._0_4_;
  iStack_b04 = auVar111._4_4_;
  iStack_b00 = auVar111._8_4_;
  iStack_afc = auVar111._12_4_;
  local_b28 = auVar112._0_4_;
  iStack_b24 = auVar112._4_4_;
  iStack_b20 = auVar112._8_4_;
  iStack_b1c = auVar112._12_4_;
  local_b48 = auVar113._0_4_;
  iStack_b44 = auVar113._4_4_;
  iStack_b40 = auVar113._8_4_;
  iStack_b3c = auVar113._12_4_;
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar113 = ZEXT416((uint)(int)in_DL);
  auVar66._4_4_ = iStack_ae4 + iVar97 >> auVar110;
  auVar66._0_4_ = local_ae8 + iVar97 >> auVar110;
  auVar66._12_4_ = iStack_adc + iVar97 >> auVar110;
  auVar66._8_4_ = iStack_ae0 + iVar97 >> auVar110;
  auVar65._4_4_ = iStack_b04 + iVar97 >> auVar111;
  auVar65._0_4_ = local_b08 + iVar97 >> auVar111;
  auVar65._12_4_ = iStack_afc + iVar97 >> auVar111;
  auVar65._8_4_ = iStack_b00 + iVar97 >> auVar111;
  auVar110 = packssdw(auVar66,auVar65);
  in_RSI[3] = auVar110;
  auVar64._4_4_ = iStack_b24 + iVar97 >> auVar112;
  auVar64._0_4_ = local_b28 + iVar97 >> auVar112;
  auVar64._12_4_ = iStack_b1c + iVar97 >> auVar112;
  auVar64._8_4_ = iStack_b20 + iVar97 >> auVar112;
  auVar63._4_4_ = iStack_b44 + iVar97 >> auVar113;
  auVar63._0_4_ = local_b48 + iVar97 >> auVar113;
  auVar63._12_4_ = iStack_b3c + iVar97 >> auVar113;
  auVar63._8_4_ = iStack_b40 + iVar97 >> auVar113;
  auVar110 = packssdw(auVar64,auVar63);
  in_RSI[4] = auVar110;
  uVar1 = *(undefined8 *)in_RSI[1];
  uVar2 = *(undefined8 *)in_RSI[6];
  local_11c8 = (undefined2)uVar1;
  uStack_11c6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_11c4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_11c2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_11d8 = (undefined2)uVar2;
  uStack_11d6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_11d4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_11d2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RSI[1] + 8);
  uVar2 = *(undefined8 *)(in_RSI[6] + 8);
  uStack_10c0 = (undefined2)uVar1;
  uStack_10be = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10bc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10ba = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_10d0 = (undefined2)uVar2;
  uStack_10ce = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10cc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10ca = (undefined2)((ulong)uVar2 >> 0x30);
  auVar117._2_2_ = local_11d8;
  auVar117._0_2_ = local_11c8;
  auVar117._4_2_ = uStack_11c6;
  auVar117._6_2_ = uStack_11d6;
  auVar117._10_2_ = uStack_11d4;
  auVar117._8_2_ = uStack_11c4;
  auVar117._12_2_ = uStack_11c2;
  auVar117._14_2_ = uStack_11d2;
  auVar116._8_8_ = CONCAT44(uVar107,uVar107);
  auVar116._0_8_ = CONCAT44(uVar107,uVar107);
  auVar116 = pmaddwd(auVar117,auVar116);
  auVar115._2_2_ = uStack_10d0;
  auVar115._0_2_ = uStack_10c0;
  auVar115._4_2_ = uStack_10be;
  auVar115._6_2_ = uStack_10ce;
  auVar115._10_2_ = uStack_10cc;
  auVar115._8_2_ = uStack_10bc;
  auVar115._12_2_ = uStack_10ba;
  auVar115._14_2_ = uStack_10ca;
  auVar114._8_8_ = CONCAT44(uVar107,uVar107);
  auVar114._0_8_ = CONCAT44(uVar107,uVar107);
  auVar114 = pmaddwd(auVar115,auVar114);
  auVar113._2_2_ = local_11d8;
  auVar113._0_2_ = local_11c8;
  auVar113._4_2_ = uStack_11c6;
  auVar113._6_2_ = uStack_11d6;
  auVar113._10_2_ = uStack_11d4;
  auVar113._8_2_ = uStack_11c4;
  auVar113._12_2_ = uStack_11c2;
  auVar113._14_2_ = uStack_11d2;
  auVar112._8_8_ = CONCAT44(iVar108,iVar108);
  auVar112._0_8_ = CONCAT44(iVar108,iVar108);
  auVar112 = pmaddwd(auVar113,auVar112);
  auVar111._2_2_ = uStack_10d0;
  auVar111._0_2_ = uStack_10c0;
  auVar111._4_2_ = uStack_10be;
  auVar111._6_2_ = uStack_10ce;
  auVar111._10_2_ = uStack_10cc;
  auVar111._8_2_ = uStack_10bc;
  auVar111._12_2_ = uStack_10ba;
  auVar111._14_2_ = uStack_10ca;
  auVar110._8_8_ = CONCAT44(iVar108,iVar108);
  auVar110._0_8_ = CONCAT44(iVar108,iVar108);
  auVar110 = pmaddwd(auVar111,auVar110);
  local_b68 = auVar116._0_4_;
  iStack_b64 = auVar116._4_4_;
  iStack_b60 = auVar116._8_4_;
  iStack_b5c = auVar116._12_4_;
  local_b88 = auVar114._0_4_;
  iStack_b84 = auVar114._4_4_;
  iStack_b80 = auVar114._8_4_;
  iStack_b7c = auVar114._12_4_;
  local_ba8 = auVar112._0_4_;
  iStack_ba4 = auVar112._4_4_;
  iStack_ba0 = auVar112._8_4_;
  iStack_b9c = auVar112._12_4_;
  local_bc8 = auVar110._0_4_;
  iStack_bc4 = auVar110._4_4_;
  iStack_bc0 = auVar110._8_4_;
  iStack_bbc = auVar110._12_4_;
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar111 = ZEXT416((uint)(int)in_DL);
  auVar112 = ZEXT416((uint)(int)in_DL);
  auVar113 = ZEXT416((uint)(int)in_DL);
  auVar62._4_4_ = iStack_b64 + iVar97 >> auVar110;
  auVar62._0_4_ = local_b68 + iVar97 >> auVar110;
  auVar62._12_4_ = iStack_b5c + iVar97 >> auVar110;
  auVar62._8_4_ = iStack_b60 + iVar97 >> auVar110;
  auVar61._4_4_ = iStack_b84 + iVar97 >> auVar111;
  auVar61._0_4_ = local_b88 + iVar97 >> auVar111;
  auVar61._12_4_ = iStack_b7c + iVar97 >> auVar111;
  auVar61._8_4_ = iStack_b80 + iVar97 >> auVar111;
  auVar110 = packssdw(auVar62,auVar61);
  in_RSI[1] = auVar110;
  auVar60._4_4_ = iStack_ba4 + iVar97 >> auVar112;
  auVar60._0_4_ = local_ba8 + iVar97 >> auVar112;
  auVar60._12_4_ = iStack_b9c + iVar97 >> auVar112;
  auVar60._8_4_ = iStack_ba0 + iVar97 >> auVar112;
  auVar59._4_4_ = iStack_bc4 + iVar97 >> auVar113;
  auVar59._0_4_ = local_bc8 + iVar97 >> auVar113;
  auVar59._12_4_ = iStack_bbc + iVar97 >> auVar113;
  auVar59._8_4_ = iStack_bc0 + iVar97 >> auVar113;
  auVar110 = packssdw(auVar60,auVar59);
  in_RSI[6] = auVar110;
  return;
}

Assistant:

static inline void fadst8x8_new_sse2(const __m128i *input, __m128i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p16_p48 = pair_set_epi16(cospi[16], cospi[48]);
  const __m128i cospi_p48_m16 = pair_set_epi16(cospi[48], -cospi[16]);
  const __m128i cospi_m48_p16 = pair_set_epi16(-cospi[48], cospi[16]);
  const __m128i cospi_p04_p60 = pair_set_epi16(cospi[4], cospi[60]);
  const __m128i cospi_p60_m04 = pair_set_epi16(cospi[60], -cospi[4]);
  const __m128i cospi_p20_p44 = pair_set_epi16(cospi[20], cospi[44]);
  const __m128i cospi_p44_m20 = pair_set_epi16(cospi[44], -cospi[20]);
  const __m128i cospi_p36_p28 = pair_set_epi16(cospi[36], cospi[28]);
  const __m128i cospi_p28_m36 = pair_set_epi16(cospi[28], -cospi[36]);
  const __m128i cospi_p52_p12 = pair_set_epi16(cospi[52], cospi[12]);
  const __m128i cospi_p12_m52 = pair_set_epi16(cospi[12], -cospi[52]);

  // stage 1
  __m128i x1[8];
  x1[0] = input[0];
  x1[1] = _mm_subs_epi16(__zero, input[7]);
  x1[2] = _mm_subs_epi16(__zero, input[3]);
  x1[3] = input[4];
  x1[4] = _mm_subs_epi16(__zero, input[1]);
  x1[5] = input[6];
  x1[6] = input[2];
  x1[7] = _mm_subs_epi16(__zero, input[5]);

  // stage 2
  __m128i x2[8];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[2], x1[3], x2[2], x2[3]);
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x1[6], x1[7], x2[6], x2[7]);

  // stage 3
  __m128i x3[8];
  x3[0] = _mm_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm_subs_epi16(x2[5], x2[7]);

  // stage 4
  __m128i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_sse2(cospi_p16_p48, cospi_p48_m16, x3[4], x3[5], x4[4], x4[5]);
  btf_16_sse2(cospi_m48_p16, cospi_p16_p48, x3[6], x3[7], x4[6], x4[7]);

  // stage 5, 6 and 7
  output[7] = _mm_adds_epi16(x4[0], x4[4]);
  output[3] = _mm_subs_epi16(x4[0], x4[4]);
  output[0] = _mm_adds_epi16(x4[1], x4[5]);
  output[4] = _mm_subs_epi16(x4[1], x4[5]);
  output[5] = _mm_adds_epi16(x4[2], x4[6]);
  output[1] = _mm_subs_epi16(x4[2], x4[6]);
  output[2] = _mm_adds_epi16(x4[3], x4[7]);
  output[6] = _mm_subs_epi16(x4[3], x4[7]);

  btf_16_sse2(cospi_p04_p60, cospi_p60_m04, output[7], output[0], output[7],
              output[0]);
  btf_16_sse2(cospi_p20_p44, cospi_p44_m20, output[5], output[2], output[5],
              output[2]);
  btf_16_sse2(cospi_p36_p28, cospi_p28_m36, output[3], output[4], output[3],
              output[4]);
  btf_16_sse2(cospi_p52_p12, cospi_p12_m52, output[1], output[6], output[1],
              output[6]);
}